

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O2

void SampleRandomPolicy(DecPOMDPDiscreteInterface *dpomdp,Arguments *args)

{
  NullPlanner *this;
  ulong uVar1;
  AgentRandom *this_00;
  ostream *poVar2;
  ulong uVar3;
  reference ppAVar4;
  uint uVar5;
  AgentFullyObservable *agent1;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> agents;
  AgentRandom agent;
  SimulationResult result;
  SimulationDecPOMDPDiscrete sim;
  
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner
            (this,(long)args->horizon,dpomdp,(PlanningUnitMADPDiscreteParameters *)0x0);
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (&sim,(PlanningUnitDecPOMDPDiscrete *)this,args);
  SimulationResult::SimulationResult(&result);
  uVar3 = 0;
  agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)this + 0x30))(this);
    if (uVar1 == uVar3) break;
    AgentRandom::AgentRandom(&agent,(PlanningUnitDecPOMDPDiscrete *)this,0);
    this_00 = (AgentRandom *)operator_new(0x28);
    AgentRandom::AgentRandom(this_00,&agent);
    agent1 = (AgentFullyObservable *)this_00;
    (**(code **)(*(long *)(this_00 + *(long *)(*(long *)this_00 + -0x18)) + 0x18))
              (this_00 + *(long *)(*(long *)this_00 + -0x18),uVar3);
    std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::push_back
              (&agents,&agent1);
    AgentRandom::~AgentRandom(&agent);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
            ((SimulationDecPOMDPDiscrete *)&agent,
             (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)&sim);
  SimulationResult::operator=(&result,(SimulationResult *)&agent);
  SimulationResult::~SimulationResult((SimulationResult *)&agent);
  if (-1 < args->verbose) {
    std::operator<<((ostream *)&std::cout,"evaluateRandomPolicy sampled value: ");
    poVar2 = std::ostream::_M_insert<double>(_result);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  uVar5 = 0;
  while( true ) {
    uVar3 = (**(code **)(*(long *)this + 0x30))(this);
    if (uVar3 == uVar5) break;
    ppAVar4 = std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::at
                        (&agents,(ulong)uVar5);
    if (*ppAVar4 != (value_type)0x0) {
      (**(code **)(*(long *)*ppAVar4 + 8))();
    }
    uVar5 = uVar5 + 1;
  }
  (**(code **)(*(long *)this + 8))(this);
  std::_Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::~_Vector_base
            (&agents.
              super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>);
  SimulationResult::~SimulationResult(&result);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(&sim);
  return;
}

Assistant:

void SampleRandomPolicy(DecPOMDPDiscreteInterface* dpomdp,
                        const ArgumentHandlers::Arguments &args)
{
    NullPlanner* np=new NullPlanner(args.horizon,dpomdp);

    SimulationDecPOMDPDiscrete sim(*np,args);
    sim.SetVerbose(false);
    SimulationResult result;

    vector<AgentFullyObservable*> agents;
    for(unsigned int i=0;i!=np->GetNrAgents();++i)
    {
        AgentFullyObservable *agent1;
        AgentRandom agent(np,0);
        agent1=new AgentRandom(agent);
        agent1->SetIndex(i);
        agents.push_back(agent1);
    }
    result=sim.RunSimulations(agents);

    if(args.verbose >= 0)
        cout << "evaluateRandomPolicy sampled value: "
             << result.GetAvgReward() << endl;

    for(unsigned int i=0;i!=np->GetNrAgents();++i)
        delete agents.at(i);
    delete np;
}